

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O3

int XmlParseXmlDecl(int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                   char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                   int *standalone)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ENCODING *pEVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *val;
  char *name;
  char *p;
  char buf_1 [128];
  char *local_100;
  undefined8 local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8 [15];
  char local_39 [9];
  
  local_d8 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_100 = ptr + (long)enc->minBytesPerChar * 5;
  local_e8 = end + (long)enc->minBytesPerChar * -2;
  local_ec = isGeneralTextEntity;
  iVar2 = parsePseudoAttribute(enc,local_100,local_e8,&local_d0,&local_e0,&local_d8,&local_100);
  pcVar5 = local_d0;
  pcVar7 = local_e0;
  pcVar6 = local_100;
  if (iVar2 == 0 || local_d0 == (char *)0x0) goto LAB_003aa303;
  iVar2 = (*enc->nameMatchesAscii)(enc,local_d0,local_e0,"version");
  if (iVar2 == 0) {
    pcVar6 = pcVar5;
    if (local_ec == 0) goto LAB_003aa303;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = local_d8;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_100;
    }
    iVar2 = parsePseudoAttribute(enc,local_100,local_e8,&local_d0,&local_e0,&local_d8,&local_100);
    pcVar6 = local_100;
    if (iVar2 == 0) goto LAB_003aa303;
    pcVar7 = local_e0;
    pcVar5 = local_d0;
    if (local_d0 == (char *)0x0) {
      if (local_ec == 0) {
        return 1;
      }
      goto LAB_003aa303;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar5,pcVar7,"encoding");
  pcVar6 = local_d8;
  if (iVar2 != 0) {
    local_b8[0] = local_d8;
    local_c8 = (char *)&local_f8;
    (*enc->utf8Convert)(enc,local_b8,local_e8,&local_c8,(char *)((long)&local_f8 + 1));
    if ((local_c8 == (char *)&local_f8) || (0x19 < ((int)(char)local_f8 & 0xffffffdfU) - 0x41))
    goto LAB_003aa303;
    if (encodingName != (char **)0x0) {
      *encodingName = pcVar6;
    }
    pcVar7 = local_100;
    if (encoding != (ENCODING **)0x0) {
      local_c0 = local_100;
      pcVar7 = local_100 + -(long)enc->minBytesPerChar;
      local_c8 = pcVar6;
      local_f8 = local_b8;
      (*enc->utf8Convert)(enc,&local_c8,pcVar7,(char **)&local_f8,local_39);
      if (local_c8 == pcVar7) {
        *(undefined1 *)local_f8 = 0;
        iVar2 = streqci((char *)local_b8,"UTF-16");
        if ((iVar2 == 0) || (pEVar4 = enc, enc->minBytesPerChar != 2)) {
          pEVar4 = (ENCODING *)0x0;
          lVar8 = 0;
          do {
            iVar2 = streqci((char *)local_b8,
                            *(char **)((long)getEncodingIndex::encodingNames + lVar8));
            if (iVar2 != 0) {
              pEVar4 = *(ENCODING **)((long)encodings + lVar8);
              break;
            }
            lVar8 = lVar8 + 8;
          } while (lVar8 != 0x30);
        }
      }
      else {
        pEVar4 = (ENCODING *)0x0;
      }
      *encoding = pEVar4;
      pcVar7 = local_c0;
    }
    iVar2 = parsePseudoAttribute(enc,pcVar7,local_e8,&local_d0,&local_e0,&local_d8,&local_100);
    pcVar6 = local_100;
    if (iVar2 == 0) goto LAB_003aa303;
    pcVar7 = local_e0;
    pcVar5 = local_d0;
    if (local_d0 == (char *)0x0) {
      return 1;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar5,pcVar7,"standalone");
  pcVar1 = local_d8;
  pcVar7 = local_100;
  pcVar6 = pcVar5;
  if ((local_ec == 0) && (iVar2 != 0)) {
    iVar2 = (*enc->nameMatchesAscii)(enc,local_d8,local_100 + -(long)enc->minBytesPerChar,"yes");
    if (iVar2 == 0) {
      iVar2 = (*enc->nameMatchesAscii)(enc,pcVar1,pcVar7 + -(long)enc->minBytesPerChar,"no");
      pcVar6 = pcVar1;
      if (iVar2 == 0) goto LAB_003aa303;
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
    if (standalone != (int *)0x0) {
      *standalone = iVar2;
    }
    while( true ) {
      local_c8 = (char *)&local_f8;
      local_b8[0] = pcVar7;
      (*enc->utf8Convert)(enc,local_b8,local_e8,&local_c8,(char *)((long)&local_f8 + 1));
      uVar3 = (ulong)(uint)(int)(char)local_f8;
      if (local_c8 == (char *)&local_f8) {
        uVar3 = 0xffffffff;
      }
      if ((0x20 < (uint)uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) break;
      pcVar7 = pcVar7 + enc->minBytesPerChar;
    }
    pcVar6 = pcVar7;
    if (pcVar7 == local_e8) {
      return 1;
    }
  }
LAB_003aa303:
  *badPtr = pcVar6;
  return 0;
}

Assistant:

int
NS(XmlParseXmlDecl)(int isGeneralTextEntity,
                    const ENCODING *enc,
                    const char *ptr,
                    const char *end,
                    const char **badPtr,
                    const char **versionPtr,
                    const char **versionEndPtr,
                    const char **encodingName,
                    const ENCODING **encoding,
                    int *standalone)
{
  return doParseXmlDecl(NS(findEncoding),
                        isGeneralTextEntity,
                        enc,
                        ptr,
                        end,
                        badPtr,
                        versionPtr,
                        versionEndPtr,
                        encodingName,
                        encoding,
                        standalone);
}